

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall
vkt::sr::ShaderRenderCase::ShaderRenderCase
          (ShaderRenderCase *this,TestContext *testCtx,string *name,string *description,
          bool isVertexCase,ShaderEvalFunc evalFunc,UniformSetup *uniformSetup,
          AttributeSetupFunc attribFunc)

{
  ShaderEvaluator *this_00;
  UniformSetup *local_90;
  DefaultDeleter<const_vkt::sr::UniformSetup> local_52;
  undefined1 local_51;
  UniformSetup *local_50;
  DefaultDeleter<const_vkt::sr::ShaderEvaluator> local_45 [13];
  ShaderEvalFunc local_38;
  ShaderEvalFunc evalFunc_local;
  string *psStack_28;
  bool isVertexCase_local;
  string *description_local;
  string *name_local;
  TestContext *testCtx_local;
  ShaderRenderCase *this_local;
  
  local_38 = evalFunc;
  evalFunc_local._7_1_ = isVertexCase;
  psStack_28 = description;
  description_local = name;
  name_local = (string *)testCtx;
  testCtx_local = (TestContext *)this;
  TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderRenderCase_016a9a00;
  std::__cxx11::string::string((string *)&this->m_vertShaderSource);
  std::__cxx11::string::string((string *)&this->m_fragShaderSource);
  this->m_isVertexCase = (bool)(evalFunc_local._7_1_ & 1);
  this_00 = (ShaderEvaluator *)operator_new(0x10);
  ShaderEvaluator::ShaderEvaluator(this_00,local_38);
  de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>::DefaultDeleter(local_45);
  de::details::
  UniquePtr<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>::
  UniquePtr(&this->m_evaluator,this_00);
  local_51 = 0;
  if (uniformSetup == (UniformSetup *)0x0) {
    local_90 = (UniformSetup *)operator_new(0x10);
    local_51 = 1;
    local_50 = local_90;
    UniformSetup::UniformSetup(local_90);
  }
  else {
    local_90 = uniformSetup;
  }
  de::DefaultDeleter<const_vkt::sr::UniformSetup>::DefaultDeleter(&local_52);
  de::details::
  UniquePtr<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>::
  UniquePtr(&this->m_uniformSetup,local_90);
  this->m_attribFunc = attribFunc;
  return;
}

Assistant:

ShaderRenderCase::ShaderRenderCase (tcu::TestContext&			testCtx,
									const std::string&			name,
									const std::string&			description,
									const bool					isVertexCase,
									const ShaderEvalFunc		evalFunc,
									const UniformSetup*			uniformSetup,
									const AttributeSetupFunc	attribFunc)
	: vkt::TestCase		(testCtx, name, description)
	, m_isVertexCase	(isVertexCase)
	, m_evaluator		(new ShaderEvaluator(evalFunc))
	, m_uniformSetup	(uniformSetup ? uniformSetup : new UniformSetup())
	, m_attribFunc		(attribFunc)
{}